

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void Cmd_unset(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint32 uVar2;
  char *pcVar3;
  FBaseCVar *this;
  FBaseCVar *var;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 2) {
    pcVar3 = FCommandLine::operator[](argv,1);
    this = FindCVar(pcVar3,(FBaseCVar **)0x0);
    if (this != (FBaseCVar *)0x0) {
      uVar2 = FBaseCVar::GetFlags(this);
      if ((uVar2 & 0x20) == 0) {
        pcVar3 = FCommandLine::operator[](argv,1);
        Printf("Cannot unset %s\n",pcVar3);
      }
      else if (this != (FBaseCVar *)0x0) {
        (*this->_vptr_FBaseCVar[1])();
      }
    }
  }
  else {
    Printf("usage: unset <variable>\n");
  }
  return;
}

Assistant:

CCMD (unset)
{
	if (argv.argc() != 2)
	{
		Printf ("usage: unset <variable>\n");
	}
	else
	{
		FBaseCVar *var = FindCVar (argv[1], NULL);
		if (var != NULL)
		{
			if (var->GetFlags() & CVAR_UNSETTABLE)
			{
				delete var;
			}
			else
			{
				Printf ("Cannot unset %s\n", argv[1]);
			}
		}
	}
}